

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * __thiscall
Mustache::QtVariantContext::eval
          (QString *__return_storage_ptr__,QtVariantContext *this,QString *key,QString *_template,
          Renderer *renderer)

{
  byte bVar1;
  function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)> local_80;
  undefined4 local_60;
  undefined1 local_50 [8];
  QVariant fn;
  Renderer *renderer_local;
  QString *_template_local;
  QString *key_local;
  QtVariantContext *this_local;
  
  fn.d._24_8_ = renderer;
  value((QVariant *)local_50,this,key);
  bVar1 = ::QVariant::isNull();
  if ((bVar1 & 1) == 0) {
    ::QVariant::value<std::function<QString(QString_const&,Mustache::Renderer*,Mustache::Context*)>>
              (&local_80,(QVariant *)local_50);
    std::function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)>::operator()
              (__return_storage_ptr__,&local_80,_template,(Renderer *)fn.d._24_8_,
               &this->super_Context);
    std::function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)>::~function
              (&local_80);
  }
  else {
    QString::QString(__return_storage_ptr__);
  }
  local_60 = 1;
  ::QVariant::~QVariant((QVariant *)local_50);
  return __return_storage_ptr__;
}

Assistant:

QString QtVariantContext::eval(const QString& key, const QString& _template, Renderer* renderer)
{
	QVariant fn = value(key);
	if (fn.isNull()) {
		return QString();
	}
	return fn.value<fn_t>()(_template, renderer, this);
}